

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int proto_eq(MIR_item_t pi1,MIR_item_t pi2,void *arg)

{
  MIR_proto_t pMVar1;
  MIR_proto_t pMVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  MIR_var_t *pMVar6;
  MIR_var_t *pMVar7;
  ulong local_58;
  size_t i_1;
  MIR_var_t *args2;
  MIR_var_t *args1;
  uint32_t i;
  MIR_proto_t p2;
  MIR_proto_t p1;
  void *arg_local;
  MIR_item_t pi2_local;
  MIR_item_t pi1_local;
  
  pMVar1 = (pi1->u).proto;
  pMVar2 = (pi2->u).proto;
  if ((pMVar1->nres == pMVar2->nres) && (pMVar1->vararg_p == pMVar2->vararg_p)) {
    sVar4 = VARR_MIR_var_tlength(pMVar1->args);
    sVar5 = VARR_MIR_var_tlength(pMVar2->args);
    if (sVar4 == sVar5) {
      for (args1._4_4_ = 0; args1._4_4_ < pMVar1->nres; args1._4_4_ = args1._4_4_ + 1) {
        if (pMVar1->res_types[args1._4_4_] != pMVar2->res_types[args1._4_4_]) {
          return 0;
        }
      }
      pMVar6 = VARR_MIR_var_taddr(pMVar1->args);
      pMVar7 = VARR_MIR_var_taddr(pMVar2->args);
      local_58 = 0;
      while( true ) {
        sVar4 = VARR_MIR_var_tlength(pMVar1->args);
        if (sVar4 <= local_58) {
          return 1;
        }
        if (((pMVar6[local_58].type != pMVar7[local_58].type) ||
            (iVar3 = strcmp(pMVar6[local_58].name,pMVar7[local_58].name), iVar3 != 0)) ||
           ((iVar3 = MIR_all_blk_type_p(pMVar6[local_58].type), iVar3 != 0 &&
            (pMVar6[local_58].size != pMVar7[local_58].size)))) break;
        local_58 = local_58 + 1;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int proto_eq (MIR_item_t pi1, MIR_item_t pi2, void *arg MIR_UNUSED) {
  MIR_proto_t p1 = pi1->u.proto, p2 = pi2->u.proto;

  if (p1->nres != p2->nres || p1->vararg_p != p2->vararg_p
      || VARR_LENGTH (MIR_var_t, p1->args) != VARR_LENGTH (MIR_var_t, p2->args))
    return FALSE;
  for (uint32_t i = 0; i < p1->nres; i++)
    if (p1->res_types[i] != p2->res_types[i]) return FALSE;

  MIR_var_t *args1 = VARR_ADDR (MIR_var_t, p1->args), *args2 = VARR_ADDR (MIR_var_t, p2->args);

  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, p1->args); i++)
    if (args1[i].type != args2[i].type || strcmp (args1[i].name, args2[i].name) != 0
        || (MIR_all_blk_type_p (args1[i].type) && args1[i].size != args2[i].size))
      return FALSE;
  return TRUE;
}